

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_svc_vui_parameters_extension(sps_svc_ext_t *sps_svc_ext,bs_t *b)

{
  uint32_t r;
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  uint32_t r_1;
  byte *pbVar4;
  uint uVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  _Bool _Var12;
  
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar5 = b->bits_left;
  uVar1 = 0xffffffff;
  iVar7 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar11 = true;
    if (pbVar4 < pbVar2) {
      bVar11 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar1 = uVar1 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar11 & uVar1 < 0x20)) && (pbVar4 < pbVar2));
  if (iVar7 == -1) {
    sVar6 = 0;
  }
  else {
    iVar3 = -2 - iVar7;
    iVar8 = -3 - iVar7;
    uVar1 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar2) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar1 = uVar1 | uVar9 << ((byte)iVar3 & 0x1f);
      sVar6 = (short)uVar1;
      iVar8 = iVar8 + -1;
      iVar3 = iVar3 + -1;
    } while (iVar8 != -2);
  }
  (sps_svc_ext->vui).vui_ext_num_entries_minus1 = ~(ushort)(-1 << (~(byte)iVar7 & 0x1f)) + sVar6;
  uVar10 = 0;
  do {
    iVar7 = 2;
    uVar1 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar2) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar1 = uVar1 | uVar9 << ((byte)iVar7 & 0x1f);
      bVar11 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar11);
    (sps_svc_ext->vui).vui_ext_dependency_id[uVar10] = (uchar)uVar1;
    pbVar2 = b->p;
    uVar5 = b->bits_left;
    uVar1 = 0;
    iVar7 = 3;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar2 < b->end) {
        uVar9 = (uint)((*pbVar2 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar1 = uVar1 | uVar9 << ((byte)iVar7 & 0x1f);
      bVar11 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar11);
    (sps_svc_ext->vui).vui_ext_quality_id[uVar10] = (uchar)uVar1;
    pbVar2 = b->p;
    uVar5 = b->bits_left;
    uVar1 = 0;
    iVar7 = 2;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar9 = 0;
      if (pbVar2 < b->end) {
        uVar9 = (uint)((*pbVar2 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar1 = uVar1 | uVar9 << ((byte)iVar7 & 0x1f);
      bVar11 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar11);
    (sps_svc_ext->vui).vui_ext_temporal_id[uVar10] = (uchar)uVar1;
    uVar5 = b->bits_left - 1;
    b->bits_left = uVar5;
    pbVar2 = b->p;
    bVar11 = false;
    if (pbVar2 < b->end) {
      bVar11 = (*pbVar2 >> (uVar5 & 0x1f) & 1) != 0;
    }
    if (uVar5 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar10] = bVar11;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    pbVar2 = b->end;
    if (bVar11) {
      uVar1 = 0;
      iVar7 = 0x1f;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar2) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar1 = uVar1 | uVar9 << ((byte)iVar7 & 0x1f);
        bVar11 = iVar7 != 0;
        iVar7 = iVar7 + -1;
      } while (bVar11);
      (sps_svc_ext->vui).vui_ext_num_units_in_tick[uVar10] = uVar1;
      uVar5 = b->bits_left;
      uVar1 = 0;
      iVar7 = 0x1f;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar9 = 0;
        if (pbVar4 < pbVar2) {
          uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar1 = uVar1 | uVar9 << ((byte)iVar7 & 0x1f);
        bVar11 = iVar7 != 0;
        iVar7 = iVar7 + -1;
      } while (bVar11);
      (sps_svc_ext->vui).vui_ext_time_scale[uVar10] = uVar1;
      uVar5 = b->bits_left - 1;
      b->bits_left = uVar5;
      if (pbVar4 < pbVar2) {
        _Var12 = (*pbVar4 >> (uVar5 & 0x1f) & 1) != 0;
      }
      else {
        _Var12 = false;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        uVar5 = 8;
      }
      (sps_svc_ext->vui).vui_ext_fixed_frame_rate_flag[uVar10] = _Var12;
    }
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar11 = false;
    if (pbVar4 < pbVar2) {
      bVar11 = (*pbVar4 >> (uVar5 & 0x1f) & 1) != 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar5 = 8;
    }
    (sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar10] = bVar11;
    if (bVar11) {
      read_hrd_parameters(sps_svc_ext->hrd_vcl + uVar10,b);
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      pbVar2 = b->end;
    }
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar11 = false;
    if (pbVar4 < pbVar2) {
      bVar11 = (*pbVar4 >> (uVar5 & 0x1f) & 1) != 0;
    }
    if (uVar5 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    (sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar10] = bVar11;
    if (bVar11) {
      read_hrd_parameters(sps_svc_ext->hrd_nal + uVar10,b);
    }
    if ((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar10] == true) {
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      pbVar2 = b->end;
LAB_00126642:
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      if (pbVar4 < pbVar2) {
        _Var12 = (*pbVar4 >> (uVar5 & 0x1f) & 1) != 0;
      }
      else {
        _Var12 = false;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        uVar5 = 8;
      }
      (sps_svc_ext->vui).vui_ext_low_delay_hrd_flag[uVar10] = _Var12;
    }
    else {
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      pbVar2 = b->end;
      if ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar10] == true)
      goto LAB_00126642;
    }
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    if (pbVar4 < pbVar2) {
      _Var12 = (*pbVar4 >> (uVar5 & 0x1f) & 1) != 0;
    }
    else {
      _Var12 = false;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar5 = 8;
    }
    (sps_svc_ext->vui).vui_ext_pic_struct_present_flag[uVar10] = _Var12;
    bVar11 = (sps_svc_ext->vui).vui_ext_num_entries_minus1 <= uVar10;
    uVar10 = uVar10 + 1;
    if (bVar11) {
      return;
    }
  } while( true );
}

Assistant:

void read_svc_vui_parameters_extension(sps_svc_ext_t* sps_svc_ext, bs_t* b)
{
    sps_svc_ext->vui.vui_ext_num_entries_minus1 = bs_read_ue(b);
    for( int i = 0; i <= sps_svc_ext->vui.vui_ext_num_entries_minus1; i++ )
    {
        sps_svc_ext->vui.vui_ext_dependency_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_quality_id[i] = bs_read_u(b, 4);
        sps_svc_ext->vui.vui_ext_temporal_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_num_units_in_tick[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_time_scale[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_fixed_frame_rate_flag[i] = bs_read_u1(b);
        }

        sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_vcl[i], b);
        }
        sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_nal[i], b);
        }
        
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] ||
            sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_low_delay_hrd_flag[i] = bs_read_u1(b);
        }
        sps_svc_ext->vui.vui_ext_pic_struct_present_flag[i] = bs_read_u1(b);
    }
}